

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_bin_ugrid_cell
          (REF_CELL ref_cell,REF_LONG ncell,REF_NODE ref_node,REF_GLOB nnode,FILE *file,
          REF_FILEPOS conn_offset,REF_FILEPOS faceid_offset,REF_BOOL swap_endian,
          REF_BOOL sixty_four_bit)

{
  uint node_per;
  REF_MPI ref_mpi;
  bool bVar1;
  REF_CELL ref_cell_00;
  uint uVar2;
  ulong uVar3;
  clock_t cVar4;
  clock_t cVar5;
  FILE *part;
  long lVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  int *piVar10;
  long lVar11;
  REF_INT *part_00;
  int iVar12;
  undefined8 uVar13;
  long lVar14;
  int iVar15;
  char *pcVar16;
  FILE *pFVar17;
  REF_GLOB *pRVar18;
  REF_INT *pRVar19;
  long lVar20;
  long *plVar21;
  uint uVar22;
  size_t __size;
  REF_FILEPOS conn_offset_00;
  ulong uVar23;
  ulong uVar24;
  size_t __size_00;
  uint local_148;
  REF_INT elements_to_receive;
  uint *local_138;
  REF_GLOB *local_130;
  long local_128;
  ulong local_120;
  long local_118;
  long local_110;
  ulong local_108;
  void *local_100;
  REF_GLOB local_f8;
  uint local_f0;
  REF_INT end_of_message;
  REF_INT *local_e8;
  long *local_e0;
  int *local_d8;
  ulong local_d0;
  FILE *local_c8;
  REF_LONG local_c0;
  long local_b8;
  long local_b0;
  clock_t local_a8;
  clock_t local_a0;
  long local_98;
  REF_FILEPOS local_90;
  ulong local_88;
  REF_CELL local_80;
  REF_NODE local_78;
  REF_INT total_add;
  REF_INT total_mpi;
  REF_INT total;
  clock_t local_60;
  clock_t local_58;
  clock_t local_50;
  ulong local_48;
  size_t local_40;
  long local_38;
  
  ref_mpi = ref_node->ref_mpi;
  end_of_message = -1;
  uVar3 = ncell / (long)ref_mpi->n;
  uVar23 = 1000000;
  if (1000000 < (int)uVar3) {
    uVar23 = uVar3 & 0xffffffff;
  }
  local_f8 = nnode;
  local_78 = ref_node;
  if ((1 < ref_mpi->timing) && (ref_mpi->id == 0)) {
    printf("chunk %d ncell %ld nproc %d\n",uVar23,ncell);
  }
  uVar2 = ref_cell->size_per * (int)uVar23;
  if ((int)uVar2 < 0) {
    pcVar16 = "malloc sent_c2n of REF_GLOB negative";
    uVar13 = 0x49c;
LAB_0019e502:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar13,
           "ref_part_bin_ugrid_cell",pcVar16);
    return 1;
  }
  node_per = ref_cell->node_per;
  __size_00 = (ulong)uVar2 << 3;
  local_108 = (long)ref_cell->size_per;
  local_c8 = file;
  local_c0 = ncell;
  local_80 = ref_cell;
  local_130 = (REF_GLOB *)malloc(__size_00);
  if (local_130 == (REF_GLOB *)0x0) {
    pcVar16 = "malloc sent_c2n of REF_GLOB NULL";
    uVar13 = 0x49c;
    goto LAB_0019e535;
  }
  local_d0 = local_108 & 0xffffffff;
  if (ref_mpi->id == 0) {
    local_90 = conn_offset;
    if ((long)ref_mpi->n < 0) {
      pcVar16 = "malloc elements_to_send of REF_INT negative";
      uVar13 = 0x49f;
      goto LAB_0019e502;
    }
    __size = (long)ref_mpi->n << 2;
    puVar9 = (uint *)malloc(__size);
    if (puVar9 == (uint *)0x0) {
      pcVar16 = "malloc elements_to_send of REF_INT NULL";
      uVar13 = 0x49f;
LAB_0019e535:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar13
             ,"ref_part_bin_ugrid_cell",pcVar16);
      return 2;
    }
    local_138 = puVar9;
    piVar10 = (int *)malloc(__size);
    if (piVar10 == (int *)0x0) {
      pcVar16 = "malloc start_to_send of REF_INT NULL";
      uVar13 = 0x4a0;
      goto LAB_0019e535;
    }
    local_e0 = (long *)malloc(__size_00);
    if (local_e0 == (long *)0x0) {
      pcVar16 = "malloc c2n of REF_GLOB NULL";
      uVar13 = 0x4a1;
      goto LAB_0019e535;
    }
    local_48 = uVar23;
    local_100 = malloc(uVar23 * 4);
    if (local_100 == (void *)0x0) {
      pcVar16 = "malloc dest of REF_INT NULL";
      uVar13 = 0x4a2;
      goto LAB_0019e535;
    }
    local_d8 = piVar10;
    if (local_c0 < 1) {
      local_110 = 0;
      local_128 = 0;
      local_118 = 0;
    }
    else {
      local_b0 = local_f8 + -1;
      local_40 = local_d0 << 3;
      local_b8 = local_108 * 8;
      local_38 = local_108 * 4;
      lVar11 = 0;
      local_118 = 0;
      local_128 = 0;
      local_110 = 0;
      conn_offset_00 = local_90;
      do {
        uVar3 = local_108;
        uVar23 = local_c0 - lVar11;
        if ((long)local_48 <= local_c0 - lVar11) {
          uVar23 = local_48;
        }
        local_a0 = clock();
        local_120 = uVar23;
        local_98 = lVar11;
        uVar2 = ref_part_bin_ugrid_pack_cell
                          (local_c8,swap_endian,sixty_four_bit,conn_offset_00,faceid_offset,
                           (REF_INT)uVar23,lVar11,node_per,(REF_INT)uVar3,local_e0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x4ac,"ref_part_bin_ugrid_cell",(ulong)uVar2,"read c2n");
          return uVar2;
        }
        local_a8 = clock();
        if (0 < (int)(uint)local_120) {
          lVar20 = (long)ref_mpi->n;
          lVar11 = (local_b0 + lVar20) / lVar20;
          lVar6 = local_f8 - (local_b0 / lVar20) * lVar20;
          uVar3 = 0;
          plVar21 = local_e0;
          do {
            lVar7 = *plVar21 / lVar11;
            if (lVar6 <= lVar7) {
              lVar7 = (*plVar21 - lVar11 * lVar6) / (local_b0 / lVar20) + lVar6;
            }
            *(int *)((long)local_100 + uVar3 * 4) = (int)lVar7;
            uVar3 = uVar3 + 1;
            plVar21 = (long *)((long)plVar21 + local_b8);
          } while (((uint)local_120 & 0x7fffffff) != uVar3);
        }
        if (0 < ref_mpi->n) {
          lVar11 = 0;
          do {
            local_138[lVar11] = 0;
            lVar11 = lVar11 + 1;
          } while (lVar11 < ref_mpi->n);
        }
        if (0 < (int)(uint)local_120) {
          uVar3 = 0;
          do {
            local_138[*(int *)((long)local_100 + uVar3 * 4)] =
                 local_138[*(int *)((long)local_100 + uVar3 * 4)] + 1;
            uVar3 = uVar3 + 1;
          } while (((uint)local_120 & 0x7fffffff) != uVar3);
        }
        *local_d8 = 0;
        iVar15 = ref_mpi->n;
        if (1 < (long)iVar15) {
          iVar12 = *local_d8;
          lVar11 = 0;
          do {
            iVar12 = iVar12 + local_138[lVar11];
            local_d8[lVar11 + 1] = iVar12;
            lVar11 = lVar11 + 1;
          } while ((long)iVar15 + -1 != lVar11);
        }
        if (0 < ref_mpi->n) {
          lVar11 = 0;
          do {
            local_138[lVar11] = 0;
            lVar11 = lVar11 + 1;
          } while (lVar11 < ref_mpi->n);
        }
        if (0 < (int)(uint)local_120) {
          local_88 = (ulong)((uint)local_120 & 0x7fffffff);
          uVar23 = 0;
          uVar24 = 0;
          uVar3 = local_108;
          puVar9 = local_138;
          do {
            iVar15 = *(int *)((long)local_100 + uVar24 * 4);
            uVar2 = puVar9[iVar15];
            if (0 < (int)uVar3) {
              memcpy(local_130 + (int)((local_d8[iVar15] + uVar2) * (int)uVar3),local_e0 + uVar23,
                     local_40);
              uVar3 = local_108;
              puVar9 = local_138;
            }
            puVar9[iVar15] = uVar2 + 1;
            uVar24 = uVar24 + 1;
            uVar23 = (ulong)(uint)((int)uVar23 + (int)uVar3);
          } while (local_88 != uVar24);
        }
        local_50 = clock();
        if (1 < ref_mpi->n) {
          lVar20 = 1;
          lVar11 = 4;
          puVar9 = local_138;
          do {
            if (0 < (int)puVar9[lVar20]) {
              uVar2 = ref_mpi_scatter_send
                                (ref_mpi,(void *)((long)puVar9 + lVar11),1,1,(REF_INT)lVar20);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x4cb,"ref_part_bin_ugrid_cell",(ulong)uVar2,"send");
                return uVar2;
              }
              uVar2 = ref_mpi_scatter_send
                                (ref_mpi,local_130 + (long)(int)local_d0 * (long)local_d8[lVar20],
                                 local_138[lVar20] * (int)local_d0,2,(REF_INT)lVar20);
              puVar9 = local_138;
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x4cf,"ref_part_bin_ugrid_cell",(ulong)uVar2,"send");
                return uVar2;
              }
            }
            lVar20 = lVar20 + 1;
            lVar11 = lVar11 + 4;
          } while (lVar20 < ref_mpi->n);
        }
        local_58 = clock();
        cVar4 = clock();
        uVar2 = *local_138;
        conn_offset_00 = local_90;
        if (0 < (int)uVar2) {
          uVar22 = uVar2 * (int)local_108;
          local_f0 = uVar2;
          if ((int)uVar22 < 0) {
            bVar1 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x4d8,"ref_part_bin_ugrid_cell","malloc sent_part of REF_INT negative");
            local_148 = 1;
            part_00 = local_e8;
          }
          else {
            part_00 = (REF_INT *)malloc((ulong)uVar22 << 2);
            if (part_00 == (REF_INT *)0x0) {
              bVar1 = false;
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x4d8,"ref_part_bin_ugrid_cell","malloc sent_part of REF_INT NULL");
              local_148 = 2;
              part_00 = (REF_INT *)0x0;
            }
            else {
              bVar1 = true;
              if ((int)local_d0 != 0) {
                if ((int)uVar22 < 2) {
                  uVar22 = 1;
                }
                memset(part_00,0xff,(ulong)uVar22 << 2);
              }
            }
          }
          if (!bVar1) {
            return local_148;
          }
          local_88 = 1;
          if (1 < (int)local_f0) {
            local_88 = (ulong)local_f0;
          }
          uVar3 = 0;
          pRVar19 = part_00;
          pRVar18 = local_130;
          do {
            if (0 < (int)node_per) {
              uVar23 = 0;
              do {
                lVar6 = (long)ref_mpi->n;
                lVar11 = (local_b0 + lVar6) / lVar6;
                lVar20 = pRVar18[uVar23] / lVar11;
                lVar7 = local_f8 - lVar6 * (local_b0 / lVar6);
                if (lVar7 <= lVar20) {
                  lVar20 = (pRVar18[uVar23] - lVar11 * lVar7) / (local_b0 / lVar6) + lVar7;
                }
                pRVar19[uVar23] = (REF_INT)lVar20;
                uVar23 = uVar23 + 1;
              } while (node_per != uVar23);
            }
            uVar3 = uVar3 + 1;
            pRVar18 = (REF_GLOB *)((long)pRVar18 + local_b8);
            pRVar19 = (REF_INT *)((long)pRVar19 + local_38);
          } while (uVar3 != local_88);
          local_e8 = part_00;
          local_60 = cVar4;
          uVar2 = ref_cell_add_many_global(local_80,local_78,local_f0,local_130,part_00,ref_mpi->id)
          ;
          cVar4 = local_60;
          conn_offset_00 = local_90;
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x4e1,"ref_part_bin_ugrid_cell",(ulong)uVar2,"glob");
            return uVar2;
          }
          if (local_e8 == (REF_INT *)0x0) {
            local_e8 = (REF_INT *)0x0;
          }
          else {
            free(local_e8);
          }
        }
        local_118 = (local_118 - local_a0) + local_a8;
        lVar11 = local_98 + (int)(uint)local_120;
        local_128 = (local_128 - local_50) + local_58;
        cVar5 = clock();
        local_110 = (local_110 - cVar4) + cVar5;
      } while (lVar11 < local_c0);
    }
    free(local_100);
    free(local_e0);
    free(local_d8);
    free(local_138);
    if (1 < ref_mpi->n) {
      iVar15 = 1;
      do {
        uVar2 = ref_mpi_scatter_send(ref_mpi,&end_of_message,1,1,iVar15);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x4f0,"ref_part_bin_ugrid_cell",(ulong)uVar2,"send");
          return uVar2;
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < ref_mpi->n);
    }
  }
  else {
    lVar11 = local_f8 + -1;
    local_b0 = local_108 * 8;
    local_b8 = local_108 << 2;
    local_118 = 0;
    local_110 = 0;
    local_128 = 0;
    do {
      cVar4 = clock();
      uVar2 = ref_mpi_scatter_recv(ref_mpi,&elements_to_receive,1,1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x4f6,"ref_part_bin_ugrid_cell",(ulong)uVar2,"recv");
        return uVar2;
      }
      cVar5 = clock();
      local_128 = local_128 + (cVar5 - cVar4);
      if (0 < elements_to_receive) {
        local_c0 = clock();
        uVar2 = ref_mpi_scatter_recv(ref_mpi,local_130,elements_to_receive * (int)local_108,2);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x4fc,"ref_part_bin_ugrid_cell",(ulong)uVar2,"send");
          return uVar2;
        }
        local_100 = (void *)clock();
        local_138 = (uint *)clock();
        uVar2 = elements_to_receive * (int)local_d0;
        if ((int)uVar2 < 0) {
          bVar1 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x501,"ref_part_bin_ugrid_cell","malloc sent_part of REF_INT negative");
          local_148 = 1;
          part = local_c8;
        }
        else {
          part = (FILE *)malloc((ulong)uVar2 * 4);
          if (part == (FILE *)0x0) {
            bVar1 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x501,"ref_part_bin_ugrid_cell","malloc sent_part of REF_INT NULL");
            local_148 = 2;
            part = (FILE *)0x0;
          }
          else {
            if (uVar2 != 0) {
              memset(part,0xff,(ulong)uVar2 << 2);
            }
            bVar1 = true;
          }
        }
        if (!bVar1) {
          return local_148;
        }
        if (0 < elements_to_receive) {
          lVar20 = 0;
          pFVar17 = part;
          pRVar18 = local_130;
          do {
            if (0 < (int)node_per) {
              uVar3 = 0;
              do {
                lVar14 = (long)ref_mpi->n;
                lVar6 = (lVar11 + lVar14) / lVar14;
                lVar7 = pRVar18[uVar3] / lVar6;
                lVar8 = lVar11 / lVar14;
                lVar14 = local_f8 - lVar14 * lVar8;
                if (lVar14 <= lVar7) {
                  lVar7 = (pRVar18[uVar3] - lVar6 * lVar14) / lVar8 + lVar14;
                }
                (&pFVar17->_flags)[uVar3] = (int)lVar7;
                uVar3 = uVar3 + 1;
              } while (node_per != uVar3);
            }
            lVar20 = lVar20 + 1;
            pRVar18 = (REF_GLOB *)((long)pRVar18 + local_b0);
            pFVar17 = (FILE *)((long)&pFVar17->_flags + local_b8);
          } while (lVar20 < elements_to_receive);
        }
        local_c8 = part;
        uVar2 = ref_cell_add_many_global
                          (local_80,local_78,elements_to_receive,local_130,&part->_flags,ref_mpi->id
                          );
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x50a,"ref_part_bin_ugrid_cell",(ulong)uVar2,"glob");
          return uVar2;
        }
        if (part != (FILE *)0x0) {
          free(part);
        }
        local_128 = (local_128 - local_c0) + (long)local_100;
        cVar4 = clock();
        local_110 = (local_110 - (long)local_138) + cVar4;
      }
    } while (elements_to_receive != end_of_message);
  }
  free(local_130);
  ref_cell_00 = local_80;
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"ugrid cell read");
  }
  uVar2 = ref_migrate_shufflin_cell(local_78,ref_cell_00);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x515,
           "ref_part_bin_ugrid_cell",(ulong)uVar2,"fill ghosts");
    return uVar2;
  }
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"ugrid cell shuffle");
  }
  if (ref_mpi->timing < 2) {
    return 0;
  }
  total = (REF_INT)local_128;
  uVar2 = ref_mpi_sum(ref_mpi,&total,&total_mpi,1,1);
  if (uVar2 == 0) {
    total = (REF_INT)local_110;
    uVar2 = ref_mpi_sum(ref_mpi,&total,&total_add,1,1);
    if (uVar2 == 0) {
      bVar1 = true;
      if (ref_mpi->id == 0) {
        printf(" read %f mpi %f add %f\n",(double)local_118 / 1000000.0,
               ((double)total_mpi / 1000000.0) / (double)ref_mpi->n,
               ((double)total_add / 1000000.0) / (double)ref_mpi->n);
      }
      goto LAB_0019e4d0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x51e,
           "ref_part_bin_ugrid_cell",(ulong)uVar2,"sum");
    local_148 = uVar2;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x51c,
           "ref_part_bin_ugrid_cell",(ulong)uVar2,"sum");
    local_148 = uVar2;
  }
  bVar1 = false;
LAB_0019e4d0:
  if (bVar1) {
    return 0;
  }
  return local_148;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid_cell(
    REF_CELL ref_cell, REF_LONG ncell, REF_NODE ref_node, REF_GLOB nnode,
    FILE *file, REF_FILEPOS conn_offset, REF_FILEPOS faceid_offset,
    REF_BOOL swap_endian, REF_BOOL sixty_four_bit) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_LONG ncell_read;
  REF_INT chunk;
  REF_INT end_of_message = REF_EMPTY;
  REF_INT elements_to_receive;
  REF_GLOB *c2n;
  REF_GLOB *sent_c2n;
  REF_INT *dest;
  REF_INT *sent_part;
  REF_INT *elements_to_send;
  REF_INT *start_to_send;
  REF_INT node_per, size_per;
  REF_INT section_size;
  REF_INT cell;
  REF_INT part, node;
  REF_INT ncell_keep;
  REF_INT new_location;
  clock_t tic;
  clock_t read_toc = 0;
  clock_t mpi_toc = 0;
  clock_t add_toc = 0;

  chunk = MAX(1000000, (REF_INT)(ncell / ref_mpi_n(ref_mpi)));

  if (1 < ref_mpi_timing(ref_mpi) && ref_mpi_once(ref_mpi))
    printf("chunk %d ncell %ld nproc %d\n", chunk, ncell, ref_mpi_n(ref_mpi));

  size_per = ref_cell_size_per(ref_cell);
  node_per = ref_cell_node_per(ref_cell);

  ref_malloc(sent_c2n, size_per * chunk, REF_GLOB);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(elements_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(c2n, size_per * chunk, REF_GLOB);
    ref_malloc(dest, chunk, REF_INT);

    ncell_read = 0;
    while (ncell_read < ncell) {
      section_size = (REF_INT)MIN((REF_LONG)chunk, ncell - ncell_read);

      tic = clock();
      RSS(ref_part_bin_ugrid_pack_cell(file, swap_endian, sixty_four_bit,
                                       conn_offset, faceid_offset, section_size,
                                       ncell_read, node_per, size_per, c2n),
          "read c2n");
      read_toc += (clock() - tic);
      ncell_read += section_size;

      for (cell = 0; cell < section_size; cell++)
        dest[cell] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), c2n[size_per * cell]);

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++)
        elements_to_send[dest[cell]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] =
            start_to_send[part - 1] + elements_to_send[part - 1];
      }
      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++) {
        new_location = start_to_send[dest[cell]] + elements_to_send[dest[cell]];
        for (node = 0; node < size_per; node++)
          sent_c2n[node + size_per * new_location] =
              c2n[node + size_per * cell];
        elements_to_send[dest[cell]]++;
      }

      tic = clock();
      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < elements_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(elements_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(
                  ref_mpi, &(sent_c2n[size_per * start_to_send[part]]),
                  size_per * elements_to_send[part], REF_GLOB_TYPE, part),
              "send");
        }
      }
      mpi_toc += (clock() - tic);
      /* rank 0 keepers */

      tic = clock();
      ncell_keep = elements_to_send[0];
      if (0 < ncell_keep) {
        ref_malloc_init(sent_part, size_per * ncell_keep, REF_INT, REF_EMPTY);

        for (cell = 0; cell < ncell_keep; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, ncell_keep, sent_c2n,
                                     sent_part, ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
      }
      add_toc += (clock() - tic);
    }

    ref_free(dest);
    ref_free(c2n);
    ref_free(start_to_send);
    ref_free(elements_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      tic = clock();
      RSS(ref_mpi_scatter_recv(ref_mpi, &elements_to_receive, 1, REF_INT_TYPE),
          "recv");
      mpi_toc += (clock() - tic);
      if (elements_to_receive > 0) {
        tic = clock();
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_c2n,
                                 size_per * elements_to_receive, REF_GLOB_TYPE),
            "send");
        mpi_toc += (clock() - tic);

        tic = clock();
        ref_malloc_init(sent_part, size_per * elements_to_receive, REF_INT,
                        REF_EMPTY);
        for (cell = 0; cell < elements_to_receive; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, elements_to_receive,
                                     sent_c2n, sent_part,
                                     ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
        add_toc += (clock() - tic);
      }
    } while (elements_to_receive != end_of_message);
  }
  free(sent_c2n);

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid cell read");
  RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "fill ghosts");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid cell shuffle");

  if (1 < ref_mpi_timing(ref_mpi)) {
    REF_INT total, total_mpi, total_add;
    total = (REF_INT)mpi_toc;
    RSS(ref_mpi_sum(ref_mpi, &total, &total_mpi, 1, REF_INT_TYPE), "sum");
    total = (REF_INT)add_toc;
    RSS(ref_mpi_sum(ref_mpi, &total, &total_add, 1, REF_INT_TYPE), "sum");
    if (ref_mpi_once(ref_mpi))
      printf(" read %f mpi %f add %f\n",
             ((REF_DBL)read_toc) / ((REF_DBL)CLOCKS_PER_SEC),
             ((REF_DBL)total_mpi) / ((REF_DBL)CLOCKS_PER_SEC) /
                 ((REF_DBL)ref_mpi_n(ref_mpi)),
             ((REF_DBL)total_add) / ((REF_DBL)CLOCKS_PER_SEC) /
                 ((REF_DBL)ref_mpi_n(ref_mpi)));
  }

  return REF_SUCCESS;
}